

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float GetColumnWidthEx(ImGuiColumnsSet *columns,int column_index,bool before_resize)

{
  value_type *pvVar1;
  float fVar2;
  float local_1c;
  float offset_norm;
  bool before_resize_local;
  int column_index_local;
  ImGuiColumnsSet *columns_local;
  
  offset_norm = (float)column_index;
  if (column_index < 0) {
    offset_norm = (float)columns->Current;
  }
  if (before_resize) {
    pvVar1 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,(int)offset_norm + 1);
    local_1c = pvVar1->OffsetNormBeforeResize;
    pvVar1 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,(int)offset_norm);
    local_1c = local_1c - pvVar1->OffsetNormBeforeResize;
  }
  else {
    pvVar1 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,(int)offset_norm + 1);
    local_1c = pvVar1->OffsetNorm;
    pvVar1 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,(int)offset_norm);
    local_1c = local_1c - pvVar1->OffsetNorm;
  }
  fVar2 = OffsetNormToPixels(columns,local_1c);
  return fVar2;
}

Assistant:

static float GetColumnWidthEx(ImGuiColumnsSet* columns, int column_index, bool before_resize = false)
{
    if (column_index < 0)
        column_index = columns->Current;

    float offset_norm;
    if (before_resize)
        offset_norm = columns->Columns[column_index + 1].OffsetNormBeforeResize - columns->Columns[column_index].OffsetNormBeforeResize;
    else
        offset_norm = columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm;
    return OffsetNormToPixels(columns, offset_norm);
}